

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc.c++:36:13)>
::getImpl(SimpleTransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_c__:36:13)>
          *this,ExceptionOrValue *output)

{
  MessageReader *pMVar1;
  word *__dest;
  Disposer *pDVar2;
  undefined **ppuVar3;
  undefined8 uVar4;
  MessageReader *elementCount;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
  aVar5;
  Fault f;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> depResult;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
  local_410;
  MessageReader *local_408;
  Maybe<capnp::MessageReaderAndFds> local_400;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_3d8;
  ArrayPtr<capnp::word> local_3b0;
  ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> local_3a0;
  ExceptionOrValue local_1f8;
  char local_60;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_58;
  
  local_1f8.exception.ptr.isSet = false;
  local_60 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1f8);
  uVar4 = local_1f8.exception.ptr.field_1.value.context.ptr.ptr;
  if (local_1f8.exception.ptr.isSet == true) {
    local_3a0.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_1f8.exception.ptr.field_1.value.ownFile.content.ptr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_1f8.exception.ptr.field_1.value.ownFile.content.size_;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_1f8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_1f8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1f8.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_1f8.exception.ptr.field_1.value.file;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_1f8.exception.ptr.field_1._32_8_;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_1f8.exception.ptr.field_1.value.description.content.ptr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_1f8.exception.ptr.field_1.value.description.content.size_;
    local_1f8.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1f8.exception.ptr.field_1.value.description.content.size_ = 0;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_1f8.exception.ptr.field_1.value.description.content.disposer;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_1f8.exception.ptr.field_1.value.context.ptr.disposer;
    local_1f8.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar4;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_1f8.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_1f8.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_1f8.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_1f8.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1f8.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_3a0.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_1f8.exception.ptr.field_1 + 0x68),0x105);
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_1f8.exception.ptr.field_1.value.details.builder.ptr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_1f8.exception.ptr.field_1.value.details.builder.pos;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_1f8.exception.ptr.field_1.value.details.builder.endPtr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_1f8.exception.ptr.field_1.value.details.builder.disposer;
    local_1f8.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1f8.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1f8.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_3a0.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> *)output,
               &local_3a0);
    aVar5 = local_3a0.value.ptr.field_1;
    if ((local_3a0.value.ptr.isSet == true) &&
       (local_3a0.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
         )0x0)) {
      local_3a0.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
            )0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar5);
    }
  }
  else {
    if (local_60 != '\x01') goto LAB_00354777;
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::moveFrom
              (&local_3d8,&local_58);
    uVar4 = local_3d8.field_1._8_8_;
    if (local_3d8.tag == 2) {
      elementCount = (MessageReader *)((ulong)local_3d8.field_1._8_8_ >> 3);
      if ((local_3d8.field_1._0_8_ & 7) == 0) {
        local_410 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
                     )local_3d8.field_1._0_8_;
        local_408 = elementCount;
        heap<capnp::FlatArrayMessageReader,kj::ArrayPtr<capnp::word>,capnp::ReaderOptions_const&>
                  ((kj *)&local_400,(ArrayPtr<capnp::word> *)&local_410.value,&(this->func).options)
        ;
        pDVar2 = (Disposer *)operator_new(0x30);
        pDVar2[1]._vptr_Disposer = (_func_int **)local_3d8.field_1._0_8_;
        pDVar2[2]._vptr_Disposer = (_func_int **)local_3d8.field_1._8_8_;
        pDVar2[3]._vptr_Disposer = (_func_int **)local_3d8.field_1._16_8_;
        local_3d8.field_1._0_8_ =
             (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
              )0x0;
        local_3d8.field_1._8_8_ = 0;
        pDVar2[4]._vptr_Disposer = (_func_int **)local_400.ptr._0_8_;
        pDVar2[5]._vptr_Disposer = (_func_int **)local_400.ptr.field_1.value.reader.disposer;
        ppuVar3 = &PTR_disposeImpl_006d2168;
      }
      else {
        __dest = (word *)HeapArrayDisposer::allocateImpl
                                   (8,(size_t)elementCount,(size_t)elementCount,
                                    (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
        local_400.ptr.field_1.value.reader.ptr = (MessageReader *)&HeapArrayDisposer::instance;
        local_400.ptr._0_8_ = __dest;
        local_400.ptr.field_1.value.reader.disposer = (Disposer *)elementCount;
        memcpy(__dest,(void *)local_3d8.field_1._0_8_,uVar4 & 0xfffffffffffffff8);
        local_3b0.ptr = __dest;
        local_3b0.size_ = (size_t)elementCount;
        heap<capnp::FlatArrayMessageReader,kj::ArrayPtr<capnp::word>,capnp::ReaderOptions_const&>
                  ((kj *)&local_410.value,&local_3b0,&(this->func).options);
        pMVar1 = local_408;
        pDVar2 = (Disposer *)operator_new(0x30);
        pDVar2[1]._vptr_Disposer = (_func_int **)__dest;
        pDVar2[2]._vptr_Disposer = (_func_int **)elementCount;
        pDVar2[3]._vptr_Disposer = (_func_int **)&HeapArrayDisposer::instance;
        *(anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
          *)(pDVar2 + 4) = local_410;
        pDVar2[5]._vptr_Disposer = (_func_int **)pMVar1;
        ppuVar3 = &PTR_disposeImpl_006d21e8;
        local_400.ptr.field_1.value.reader.disposer = (Disposer *)pMVar1;
      }
      pDVar2->_vptr_Disposer = (_func_int **)ppuVar3;
      local_400.ptr.field_1.value.reader.ptr = (MessageReader *)0x1;
      if ((MessageReader *)local_400.ptr.field_1.value.reader.disposer != (MessageReader *)0x0) {
        local_400.ptr.field_1.value.reader.ptr =
             (MessageReader *)local_400.ptr.field_1.value.reader.disposer;
      }
      local_400.ptr.field_1.value.fds.ptr = (OwnFd *)0x0;
      local_400.ptr.field_1.value.fds.size_ = 0;
      local_400.ptr.isSet = true;
      local_400.ptr.field_1.value.reader.disposer = pDVar2;
      PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<kj::Maybe<capnp::MessageReaderAndFds>>,kj::_::PromiseDisposer,kj::Maybe<capnp::MessageReaderAndFds>>
                ((PromiseDisposer *)&local_410.value,&local_400);
      uVar4 = local_400.ptr.field_1.value.reader.ptr;
      aVar5 = local_410;
      if ((local_400.ptr.field_1.value.reader.ptr != (MessageReader *)0x0 & local_400.ptr.isSet) ==
          1) goto LAB_003546fd;
    }
    else {
      if (local_3d8.tag != 3) {
        if (local_3d8.tag != 1) {
          unreachable();
        }
        Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
                  ((Fault *)&local_400,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc.c++"
                   ,0x2b,FAILED,(char *)0x0,
                   "\"Unexpected websocket text message; expected only binary messages.\"",
                   (char (*) [66])
                   "Unexpected websocket text message; expected only binary messages.");
        Debug::Fault::fatal((Fault *)&local_400);
      }
      local_400.ptr._0_8_ = local_400.ptr._0_8_ & 0xffffffffffffff00;
      PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<kj::Maybe<capnp::MessageReaderAndFds>>,kj::_::PromiseDisposer,kj::Maybe<capnp::MessageReaderAndFds>>
                ((PromiseDisposer *)&local_410.value,&local_400);
      aVar5 = local_410;
      if (((kj)local_400.ptr.isSet == (kj)0x1) &&
         (uVar4 = local_400.ptr.field_1.value.reader.ptr,
         local_400.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
LAB_003546fd:
        aVar5 = local_410;
        local_400.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
        (**(local_400.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
                  (local_400.ptr.field_1.value.reader.disposer,
                   (code *)((long)((MessageReader *)uVar4)->arenaSpace +
                           (long)(((MessageReader *)uVar4)->_vptr_MessageReader[-2] + -0x18)));
      }
    }
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy(&local_3d8);
    local_3a0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3a0.value.ptr.isSet = true;
    local_3a0.value.ptr.field_1 = aVar5;
    ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> *)output,
               &local_3a0);
    aVar5 = local_3a0.value.ptr.field_1;
    if ((local_3a0.value.ptr.isSet == true) &&
       (local_3a0.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
         )0x0)) {
      local_3a0.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
            )0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar5);
    }
  }
  if (local_3a0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_00354777:
  if (local_60 == '\x01') {
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy(&local_58);
  }
  if (local_1f8.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1f8.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }